

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockBufferImageGranularity::AllocPages
          (VmaBlockBufferImageGranularity *this,uint8_t allocType,VkDeviceSize offset,
          VkDeviceSize size)

{
  RegionInfo *pRVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->m_BufferImageGranularity;
  if (0x100 < uVar3) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = (-uVar3 & offset) >> ((byte)lVar2 & 0x3f);
    pRVar1 = this->m_RegionInfo;
    uVar5 = uVar4 & 0xffffffff;
    if ((pRVar1[uVar5].allocCount == 0) || (pRVar1[uVar5].allocType == '\0')) {
      pRVar1[uVar5].allocType = allocType;
    }
    pRVar1[uVar5].allocCount = pRVar1[uVar5].allocCount + 1;
    uVar3 = ((size + offset) - 1 & -uVar3) >> ((byte)lVar2 & 0x3f);
    if ((int)uVar4 != (int)uVar3) {
      uVar3 = uVar3 & 0xffffffff;
      if ((pRVar1[uVar3].allocCount == 0) || (pRVar1[uVar3].allocType == '\0')) {
        pRVar1[uVar3].allocType = allocType;
      }
      pRVar1[uVar3].allocCount = pRVar1[uVar3].allocCount + 1;
    }
  }
  return;
}

Assistant:

bool IsEnabled() const { return m_BufferImageGranularity > MAX_LOW_BUFFER_IMAGE_GRANULARITY; }